

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 SyMemcpy(void *pSrc,void *pDest,sxu32 nLen)

{
  sxu32 local_3c;
  uchar *puStack_38;
  sxu32 xLen;
  uchar *xDst;
  uchar *xSrc;
  sxu32 nLen_local;
  void *pDest_local;
  void *pSrc_local;
  
  if ((pSrc == (void *)0x0) || (pDest == (void *)0x0)) {
    pSrc_local._4_4_ = 0;
  }
  else {
    local_3c = nLen;
    puStack_38 = (uchar *)pDest;
    xDst = (uchar *)pSrc;
    pSrc_local._4_4_ = nLen;
    if (pSrc != pDest) {
      for (; local_3c != 0; local_3c = local_3c - 4) {
        *puStack_38 = *xDst;
        if (local_3c == 1) {
          return nLen;
        }
        puStack_38[1] = xDst[1];
        if (local_3c == 2) {
          return nLen;
        }
        puStack_38[2] = xDst[2];
        if (local_3c == 3) {
          return nLen;
        }
        puStack_38[3] = xDst[3];
        puStack_38 = puStack_38 + 4;
        xDst = xDst + 4;
      }
    }
  }
  return pSrc_local._4_4_;
}

Assistant:

JX9_PRIVATE sxu32 SyMemcpy(const void *pSrc, void *pDest, sxu32 nLen)
{
	if( pSrc == 0 || pDest == 0 ){
		return 0;
	}
	if( pSrc == (const void *)pDest ){
		return nLen;
	}
	SX_MACRO_FAST_MEMCPY(pSrc, pDest, nLen);
	return nLen;
}